

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalGenerator.cpp
# Opt level: O3

void __thiscall SignalGenerator::SignalGenerator(SignalGenerator *this)

{
  double dVar1;
  SignalGenerator_param *pSVar2;
  Clock *pCVar3;
  Logging *pLVar4;
  
  (this->super_Neuron)._vptr_Neuron = (_func_int **)&PTR_update_00122b78;
  pSVar2 = (SignalGenerator_param *)operator_new(0x58);
  pSVar2->f1 = 1.0;
  pSVar2->f2 = 0.0;
  pSVar2->f3 = 0.0;
  pSVar2->f4 = 0.0;
  pSVar2->f5 = 0.0;
  pSVar2->f6 = 0.0;
  pSVar2->f7 = 0.0;
  pSVar2->scale = 1.0;
  pSVar2->offset = 0.0;
  pSVar2->noiseMean = 0.0;
  pSVar2->noiseStd = 0.0;
  this->param = pSVar2;
  (this->generator)._M_x = 1;
  *(undefined4 *)&(this->distribution)._M_param._M_mean = 0;
  *(undefined4 *)((long)&(this->distribution)._M_param._M_mean + 4) = 0;
  *(undefined4 *)&(this->distribution)._M_param._M_stddev = 0;
  *(undefined4 *)((long)&(this->distribution)._M_param._M_stddev + 4) = 0x3ff00000;
  (this->distribution)._M_saved = 0.0;
  (this->distribution)._M_saved_available = false;
  pCVar3 = Clock::getInstance();
  this->clock = pCVar3;
  pLVar4 = Logging::getInstance();
  (this->super_Neuron).logger = pLVar4;
  std::chrono::_V2::system_clock::now();
  (this->generator)._M_x = 1;
  dVar1 = this->param->noiseStd;
  (this->distribution)._M_param._M_mean = this->param->noiseMean;
  (this->distribution)._M_param._M_stddev = dVar1;
  (this->distribution)._M_saved = 0.0;
  (this->distribution)._M_saved_available = false;
  return;
}

Assistant:

SignalGenerator::SignalGenerator() : param(new SignalGenerator_param) {
    clock = Clock::getInstance();
    initialize();
    unsigned seed = std::chrono::system_clock::now().time_since_epoch().count();
    generator = std::default_random_engine(0);
    distribution = std::normal_distribution<double>(param->noiseMean, param->noiseStd);
}